

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CZ.hpp
# Opt level: O1

void __thiscall qclab::qgates::CZ<std::complex<float>_>::CZ(CZ<std::complex<float>_> *this)

{
  PauliZ<std::complex<float>_> *pPVar1;
  
  (this->super_QControlledGate2<std::complex<float>_>).control_ = 0;
  (this->super_QControlledGate2<std::complex<float>_>).controlState_ = 1;
  (this->super_QControlledGate2<std::complex<float>_>).super_QGate2<std::complex<float>_>.
  super_QObject<std::complex<float>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_00525278;
  pPVar1 = (PauliZ<std::complex<float>_> *)operator_new(0x10);
  (pPVar1->super_QGate1<std::complex<float>_>).qubit_ = 1;
  (pPVar1->super_QGate1<std::complex<float>_>).super_QObject<std::complex<float>_> =
       (QObject<std::complex<float>_>)&PTR_nbQubits_0051f788;
  (this->gate_)._M_t.
  super___uniq_ptr_impl<qclab::qgates::PauliZ<std::complex<float>_>,_std::default_delete<qclab::qgates::PauliZ<std::complex<float>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_qclab::qgates::PauliZ<std::complex<float>_>_*,_std::default_delete<qclab::qgates::PauliZ<std::complex<float>_>_>_>
  .super__Head_base<0UL,_qclab::qgates::PauliZ<std::complex<float>_>_*,_false>._M_head_impl = pPVar1
  ;
  return;
}

Assistant:

CZ()
        : QControlledGate2< T >( 0 )
        , gate_( std::make_unique< PauliZ< T > >( 1 ) )
        { }